

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmake.h
# Opt level: O0

string * __thiscall
cmake::GetTopCheckInProgressMessage_abi_cxx11_(string *__return_storage_ptr__,cmake *this)

{
  reference pvVar1;
  cmake *this_local;
  value_type *message;
  
  pvVar1 = std::
           stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::top(&this->CheckInProgressMessages);
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)pvVar1);
  std::
  stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::pop(&this->CheckInProgressMessages);
  return __return_storage_ptr__;
}

Assistant:

std::string GetTopCheckInProgressMessage()
  {
    auto message = this->CheckInProgressMessages.top();
    this->CheckInProgressMessages.pop();
    return message;
  }